

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)

{
  char cVar1;
  undefined1 auVar2 [12];
  bool bVar3;
  CutResult CVar4;
  qint64 qVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  byte bVar10;
  int in_R8D;
  int iVar11;
  int iVar12;
  long in_FS_OFFSET;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 uVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  QByteArrayView needle;
  QByteArrayView data;
  iterator __begin1;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 local_78 [16];
  undefined1 *local_68;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  needle.m_data = "UTC";
  needle.m_size = 3;
  bVar3 = QtPrivate::startsWith(id,needle);
  qVar5 = -0x80000000;
  if (4 < id.m_size && bVar3) {
    cVar1 = id.m_data[3];
    if ((cVar1 == '-') || (cVar1 == '+')) {
      local_b8._0_8_ = (QStringTokenizerBase<QLatin1String,_QChar> *)0x4;
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0xffffffff;
      local_58.super_QStringTokenizerBaseBase.m_cs = ~CaseInsensitive;
      CVar4 = QtPrivate::QContainerImplHelper::mid
                        (id.m_size,(qsizetype *)local_b8,(qsizetype *)&local_58);
      iVar11 = 0;
      if (CVar4 == Null) {
        local_58.m_haystack.m_size._0_4_ = (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
        local_58.m_haystack.m_size._4_4_ = CaseInsensitive;
        local_58.m_haystack.m_data = (storage_type *)0x0;
      }
      else {
        local_58.m_haystack.m_data = id.m_data + local_b8._0_8_;
        local_58.m_haystack.m_size = (qsizetype)local_58.super_QStringTokenizerBaseBase;
      }
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
      local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_58.m_needle.ucs = L':';
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator((iterator *)local_b8,&local_58)
      ;
      iVar12 = 0;
      bVar10 = local_b8[0x18];
      uVar15 = extraout_XMM0_Qb;
      if (local_b8[0x18] == true) {
        iVar11 = 0;
        do {
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          data.m_data = (storage_type *)0xa;
          data.m_size = local_b8._16_8_;
          QtPrivate::toUnsignedInteger
                    ((ParsedNumber<unsigned_long_long> *)local_78,(QtPrivate *)local_b8._8_8_,data,
                     in_R8D);
          if ((ulong)local_78._0_8_ < (undefined1 *)0x10000 && (local_78._8_8_ & 1) == 0) {
            uVar6 = 0x3c;
            if (iVar11 == 0) {
              uVar6 = 0x18;
            }
            if (uVar6 <= (uint)local_78._0_8_) goto LAB_00403b79;
            iVar12 = iVar12 * 0x3c + (uint)local_78._0_8_;
            bVar3 = iVar11 < 3;
            iVar11 = iVar11 + 1;
          }
          else {
LAB_00403b79:
            bVar3 = false;
          }
          uVar15 = extraout_XMM0_Qb_00;
          if (!bVar3) break;
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_b8);
          bVar10 = local_b8[0x18];
          uVar15 = extraout_XMM0_Qb_01;
        } while (local_b8[0x18] != false);
      }
      qVar5 = -0x80000000;
      if (iVar11 != 0 && (bVar10 & 1) == 0) {
        if (iVar11 < 3) {
          uVar6 = 2 - iVar11;
          auVar2._4_8_ = uVar15;
          auVar2._0_4_ = 1;
          auVar13._0_8_ = auVar2._0_8_ << 0x20;
          auVar13._8_4_ = 1;
          auVar13._12_4_ = 1;
          auVar17._4_12_ = auVar13._4_12_;
          auVar17._0_4_ = iVar12;
          iVar12 = 4;
          do {
            auVar13 = auVar17;
            auVar17._0_4_ = auVar13._0_4_ * 0x3c;
            auVar14._8_4_ = (undefined4)((auVar13._8_8_ & 0xffffffff) * 0x3c);
            auVar14._4_4_ = auVar14._8_4_;
            auVar14._0_4_ = auVar17._0_4_;
            iVar7 = auVar13._4_4_;
            auVar18._4_4_ = iVar7;
            auVar18._0_4_ = iVar7;
            auVar18._8_4_ = auVar13._12_4_;
            auVar18._12_4_ = auVar13._12_4_;
            auVar14._12_4_ = (int)((auVar18._8_8_ & 0xffffffff) * 0x3c);
            auVar17._8_8_ = auVar14._8_8_;
            auVar17._4_4_ = iVar7 * 0x3c;
            iVar7 = iVar12 + -4;
            iVar9 = iVar12 + (6U - iVar11 & 0xfffffffc);
            iVar12 = iVar7;
          } while (iVar9 != 8);
          uVar8 = -iVar7;
          auVar16._0_4_ = -(uint)((int)(uVar6 ^ 0x80000000) < (int)(uVar8 ^ 0x80000000));
          auVar16._4_4_ = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar8 | 1) ^ 0x80000000));
          auVar16._8_4_ = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar8 | 2) ^ 0x80000000));
          auVar16._12_4_ = -(uint)((int)(uVar6 ^ 0x80000000) < (int)((uVar8 | 3) ^ 0x80000000));
          auVar17 = ~auVar16 & auVar17 | auVar13 & auVar16;
          iVar12 = auVar17._8_4_ * auVar17._0_4_ * auVar17._4_4_ * auVar17._12_4_;
        }
        iVar11 = -iVar12;
        if (cVar1 != '-') {
          iVar11 = iVar12;
        }
        qVar5 = (qint64)iVar11;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar5;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)
{
    // Convert reasonable UTC[+-]\d+(:\d+){,2} to offset in seconds.
    // Assumption: id has already been tried as a CLDR UTC offset ID (notably
    // including plain "UTC" itself) and a system offset ID; it's neither.
    if (!id.startsWith("UTC") || id.size() < 5)
        return invalidSeconds(); // Doesn't match
    const char signChar = id.at(3);
    if (signChar != '-' && signChar != '+')
        return invalidSeconds(); // No sign
    const int sign = signChar == '-' ? -1 : 1;

    qint32 seconds = 0;
    int prior = 0; // Number of fields parsed thus far
    for (auto offset : QLatin1StringView(id.mid(4)).tokenize(':'_L1)) {
        bool ok = false;
        unsigned short field = offset.toUShort(&ok);
        // Bound hour above at 24, minutes and seconds at 60:
        if (!ok || field >= (prior ? 60 : 24))
            return invalidSeconds();
        seconds = seconds * 60 + field;
        if (++prior > 3)
            return invalidSeconds(); // Too many numbers
    }

    if (!prior)
        return invalidSeconds(); // No numbers

    while (prior++ < 3)
        seconds *= 60;

    return seconds * sign;
}